

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O3

void CmdPrintTable(st__table *tTable,int fAliases)

{
  int iVar1;
  void *__base;
  st__generator *gen;
  Abc_Frame_t *pAbc;
  ulong uVar2;
  ulong uVar3;
  char *value;
  char *key;
  Abc_Alias *local_48;
  int local_3c;
  char *local_38;
  
  local_3c = fAliases;
  __base = malloc((long)tTable->num_entries << 3);
  gen = st__init_gen(tTable);
  iVar1 = st__gen(gen,&local_38,(char **)&local_48);
  uVar2 = 0;
  if (iVar1 != 0) {
    do {
      *(char **)((long)__base + uVar2 * 8) = local_38;
      uVar2 = uVar2 + 1;
      iVar1 = st__gen(gen,&local_38,(char **)&local_48);
    } while (iVar1 != 0);
  }
  st__free_gen(gen);
  qsort(__base,uVar2 & 0xffffffff,8,CmdNamePrintCompare);
  iVar1 = local_3c;
  if ((int)uVar2 == 0) {
    if (__base == (void *)0x0) {
      return;
    }
  }
  else {
    uVar3 = 0;
    do {
      st__lookup(tTable,*(char **)((long)__base + uVar3 * 8),(char **)&local_48);
      if (iVar1 == 0) {
        fprintf(_stdout,"%-15s %-15s\n",*(undefined8 *)((long)__base + uVar3 * 8),local_48);
      }
      else {
        pAbc = Abc_FrameGetGlobalFrame();
        CmdCommandAliasPrint(pAbc,local_48);
      }
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0xffffffff) != uVar3);
  }
  free(__base);
  return;
}

Assistant:

void CmdPrintTable( st__table * tTable, int fAliases )
{
    st__generator * gen;
    const char ** ppNames;
    const char * key;
    char* value;
    int nNames, i;

    // collect keys in the array
    ppNames = ABC_ALLOC( const char *, st__count(tTable) );
    nNames = 0;
    st__foreach_item( tTable, gen, &key, &value )
        ppNames[nNames++] = key;

    // sort array by name
    qsort( (void *)ppNames, nNames, sizeof(char *), 
        (int (*)(const void *, const void *))CmdNamePrintCompare );

    // print in this order
    for ( i = 0; i < nNames; i++ )
    {
        st__lookup( tTable, ppNames[i], &value );
        if ( fAliases )
            CmdCommandAliasPrint( Abc_FrameGetGlobalFrame(), (Abc_Alias *)value );
        else
            fprintf( stdout, "%-15s %-15s\n", ppNames[i], value );
    }
    ABC_FREE( ppNames );
}